

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLMG.cpp
# Opt level: O0

void __thiscall amrex::MLMG::interpCorrection(MLMG *this,int alev)

{
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  int in_ESI;
  long in_RDI;
  Periodicity PVar4;
  Any cfine;
  int ng_dst;
  int ng_src;
  Geometry *crse_geom;
  Any *fine_cor;
  Any *crse_cor;
  IntVect nghost;
  size_type in_stack_ffffffffffffff18;
  long *plVar5;
  MLLinOp *in_stack_ffffffffffffff20;
  IntVect *this_00;
  Geometry *this_01;
  undefined8 local_a0;
  int local_98;
  undefined8 local_90;
  int local_88;
  IntVect local_84;
  IntVect local_78 [2];
  IntVect local_5c;
  undefined1 local_50 [52];
  int local_1c;
  Real local_18;
  int local_10;
  int local_c;
  
  local_c = in_ESI;
  IntVect::IntVect((IntVect *)&local_18,0);
  if (*(int *)(in_RDI + 0x24) == 1) {
    iVar3 = (**(code **)(**(long **)(in_RDI + 0x48) + 0x30))(*(long **)(in_RDI + 0x48),local_c,0);
    IntVect::IntVect((IntVect *)(local_50 + 0x2c),iVar3);
    local_18 = (Real)local_50._44_8_;
    local_10 = local_1c;
  }
  Vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
  ::operator[]((Vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  local_50._32_8_ =
       Vector<amrex::Any,_std::allocator<amrex::Any>_>::operator[]
                 ((Vector<amrex::Any,_std::allocator<amrex::Any>_> *)in_stack_ffffffffffffff20,
                  in_stack_ffffffffffffff18);
  Vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
  ::operator[]((Vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  local_50._24_8_ =
       Vector<amrex::Any,_std::allocator<amrex::Any>_>::operator[]
                 ((Vector<amrex::Any,_std::allocator<amrex::Any>_> *)in_stack_ffffffffffffff20,
                  in_stack_ffffffffffffff18);
  local_50._16_8_ =
       MLLinOp::Geom(in_stack_ffffffffffffff20,(int)(in_stack_ffffffffffffff18 >> 0x20),
                     (int)in_stack_ffffffffffffff18);
  local_50._12_4_ = 0;
  bVar2 = MLLinOp::isCellCentered(*(MLLinOp **)(in_RDI + 0x48));
  local_50._8_4_ = ZEXT14(bVar2);
  if (*(int *)(in_RDI + 0x24) == 1) {
    local_50._12_4_ =
         (**(code **)(**(long **)(in_RDI + 0x48) + 0x30))(*(long **)(in_RDI + 0x48),local_c + -1,0);
    local_50._8_4_ =
         (**(code **)(**(long **)(in_RDI + 0x48) + 0x30))(*(long **)(in_RDI + 0x48),local_c + -1,0);
  }
  iVar3 = local_c;
  plVar5 = *(long **)(in_RDI + 0x48);
  IntVect::IntVect(&local_5c,local_50._8_4_);
  this_01 = (Geometry *)local_50;
  (**(code **)(*plVar5 + 0x148))(this_01,plVar5,iVar3,&local_5c);
  (**(code **)(**(long **)(in_RDI + 0x48) + 0x170))(*(long **)(in_RDI + 0x48),this_01);
  uVar1 = local_50._32_8_;
  plVar5 = *(long **)(in_RDI + 0x48);
  this_00 = local_78;
  IntVect::IntVect(this_00,local_50._12_4_);
  IntVect::IntVect(&local_84,local_50._8_4_);
  PVar4 = Geometry::periodicity(this_01);
  local_98 = PVar4.period.vect[2];
  local_88 = local_98;
  local_a0 = PVar4.period.vect._0_8_;
  local_90 = local_a0;
  (**(code **)(*plVar5 + 0x188))(plVar5,local_50,uVar1,this_00,&local_84,&local_90);
  (**(code **)(**(long **)(in_RDI + 0x48) + 0x1e8))
            (*(long **)(in_RDI + 0x48),local_c,local_50._24_8_,local_50,&local_18);
  Any::~Any((Any *)0x14f9891);
  return;
}

Assistant:

void
MLMG::interpCorrection (int alev)
{
    BL_PROFILE("MLMG::interpCorrection_1");

    IntVect nghost(0);
    if (cf_strategy == CFStrategy::ghostnodes) nghost = IntVect(linop.getNGrow(alev));

    Any const& crse_cor = cor[alev-1][0];
    Any      & fine_cor = cor[alev  ][0];

    const Geometry& crse_geom = linop.Geom(alev-1,0);

    int ng_src = 0;
    int ng_dst = linop.isCellCentered() ? 1 : 0;
    if (cf_strategy == CFStrategy::ghostnodes)
    {
        ng_src = linop.getNGrow(alev-1);
        ng_dst = linop.getNGrow(alev-1);
    }

    Any cfine = linop.AnyMakeCoarseAmr(alev, IntVect(ng_dst));
    linop.AnySetToZero(cfine);
    linop.AnyParallelCopy(cfine, crse_cor, IntVect(ng_src), IntVect(ng_dst), crse_geom.periodicity());

    linop.AnyInterpolationAmr(alev, fine_cor, cfine, nghost);
}